

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

FRemapTable * __thiscall FRemapTable::operator=(FRemapTable *this,FRemapTable *o)

{
  BYTE *__dest;
  
  if (o != this) {
    if (o->NumEntries != this->NumEntries) {
      Free(this);
    }
    __dest = this->Remap;
    if (__dest == (BYTE *)0x0) {
      Alloc(this,o->NumEntries);
      __dest = this->Remap;
    }
    this->Inactive = o->Inactive;
    memcpy(__dest,o->Remap,(long)this->NumEntries * 5);
  }
  return this;
}

Assistant:

FRemapTable &FRemapTable::operator=(const FRemapTable &o)
{
	if (&o == this)
	{
		return *this;
	}
	if (o.NumEntries != NumEntries)
	{
		Free();
	}
	if (Remap == NULL)
	{
		Alloc(o.NumEntries);
	}
	Inactive = o.Inactive;
	memcpy(Remap, o.Remap, NumEntries*sizeof(*Remap) + NumEntries*sizeof(*Palette));
	return *this;
}